

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * __thiscall
cfd::core::Privkey::GeneratePubkey(Pubkey *__return_storage_ptr__,Privkey *this,bool is_compressed)

{
  int iVar1;
  uchar *puVar2;
  size_t priv_key_len;
  uchar *puVar3;
  size_type sVar4;
  CfdException *pCVar5;
  size_type len;
  ByteData local_198;
  undefined1 local_17a;
  allocator local_179;
  string local_178;
  ByteData local_158;
  string local_140;
  CfdSourceLocation local_120;
  allocator<unsigned_char> local_101;
  undefined1 local_100 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed_pubkey;
  ByteData local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0;
  string local_a0;
  CfdSourceLocation local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  int local_50 [2];
  int ret;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  bool is_compressed_local;
  Privkey *this_local;
  
  pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = is_compressed;
  ::std::allocator<unsigned_char>::allocator(&local_39);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x21,&local_39);
  ::std::allocator<unsigned_char>::~allocator(&local_39);
  ByteData::GetBytes(&local_68,&this->data_);
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  priv_key_len = ByteData::GetDataSize(&this->data_);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  iVar1 = wally_ec_public_key_from_private_key(puVar2,priv_key_len,puVar3,sVar4);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  local_50[0] = iVar1;
  if (iVar1 != 0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_key.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x18a;
    local_80.funcname = "GeneratePubkey";
    ByteData::GetHex_abi_cxx11_(&local_a0,&this->data_);
    logger::warn<int&,std::__cxx11::string>
              (&local_80,"wally_ec_public_key_from_private_key error. ret={} privkey={}.",local_50,
               &local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    local_c2 = 1;
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_c0,"Generate Pubkey error.",&local_c1);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_c0);
    local_c2 = 0;
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    ::std::allocator<unsigned_char>::allocator(&local_101);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100,0x41,&local_101);
    ::std::allocator<unsigned_char>::~allocator(&local_101);
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
    local_50[0] = wally_ec_public_key_decompress(puVar2,sVar4,puVar3,len);
    if (local_50[0] != 0) {
      local_120.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_key.cpp"
                   ,0x2f);
      local_120.filename = local_120.filename + 1;
      local_120.line = 0x19a;
      local_120.funcname = "GeneratePubkey";
      ByteData::ByteData(&local_158,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
      ByteData::GetHex_abi_cxx11_(&local_140,&local_158);
      logger::warn<int&,std::__cxx11::string>
                (&local_120,"wally_ec_public_key_decompress error. ret={} compressed pubkey={}.",
                 local_50,&local_140);
      ::std::__cxx11::string::~string((string *)&local_140);
      ByteData::~ByteData(&local_158);
      local_17a = 1;
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_178,"Decompressed Pubkey error.",&local_179);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_178);
      local_17a = 0;
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData(&local_198,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100
                      );
    Pubkey::Pubkey(__return_storage_ptr__,&local_198);
    ByteData::~ByteData(&local_198);
    uncompressed_pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
  }
  else {
    ByteData::ByteData(&local_e0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    Pubkey::Pubkey(__return_storage_ptr__,&local_e0);
    ByteData::~ByteData(&local_e0);
    uncompressed_pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Privkey::GeneratePubkey(bool is_compressed) const {
  std::vector<uint8_t> pubkey(Pubkey::kCompressedPubkeySize);
  int ret = wally_ec_public_key_from_private_key(
      data_.GetBytes().data(), data_.GetDataSize(), pubkey.data(),
      pubkey.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_ec_public_key_from_private_key error. ret={} privkey={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Generate Pubkey error.");
  }
  if (is_compressed) {
    return Pubkey(pubkey);
  }

  std::vector<uint8_t> uncompressed_pubkey(Pubkey::kPubkeySize);
  ret = wally_ec_public_key_decompress(
      pubkey.data(), pubkey.size(), uncompressed_pubkey.data(),
      uncompressed_pubkey.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_ec_public_key_decompress error. ret={} compressed pubkey={}.",
        ret, ByteData(pubkey).GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Decompressed Pubkey error.");
  }
  return Pubkey(uncompressed_pubkey);
}